

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

xmlNodePtr xmlAddChild(xmlNodePtr parent,xmlNodePtr cur)

{
  _xmlNode *p_Var1;
  xmlNodePtr pxVar2;
  _xmlNode *p_Var3;
  xmlChar *nsName;
  
  if (((parent != (xmlNodePtr)0x0) && (cur != (xmlNodePtr)0x0 && parent->type != XML_NAMESPACE_DECL)
      ) && (parent != cur && cur->type != XML_NAMESPACE_DECL)) {
    if (cur->type == XML_TEXT_NODE) {
      if (((parent->type == XML_TEXT_NODE) && (parent->content != (xmlChar *)0x0)) &&
         (parent->name == cur->name)) goto LAB_00188e95;
      pxVar2 = parent->last;
      if (((pxVar2 != (xmlNodePtr)0x0) && (pxVar2->type == XML_TEXT_NODE)) &&
         ((pxVar2 != cur && (pxVar2->name == cur->name)))) {
        xmlNodeAddContent(pxVar2,cur->content);
        xmlFreeNode(cur);
        return parent->last;
      }
    }
    p_Var1 = cur->parent;
    cur->parent = parent;
    if (cur->doc != parent->doc) {
      xmlSetTreeDoc(cur,parent->doc);
    }
    if (p_Var1 == parent) {
      return cur;
    }
    if (parent->type == XML_TEXT_NODE) {
      if (parent->content != (xmlChar *)0x0) {
LAB_00188e95:
        xmlNodeAddContent(parent,cur->content);
        xmlFreeNode(cur);
        return parent;
      }
      if (cur->type != XML_ATTRIBUTE_NODE) goto LAB_00188ee8;
    }
    else {
      if (cur->type != XML_ATTRIBUTE_NODE) {
LAB_00188ee8:
        if (parent->children == (_xmlNode *)0x0) {
          parent->children = cur;
        }
        else {
          p_Var1 = parent->last;
          p_Var1->next = cur;
          cur->prev = p_Var1;
        }
        parent->last = cur;
        return cur;
      }
      if (parent->type == XML_ELEMENT_NODE) {
        if (parent->properties != (_xmlAttr *)0x0) {
          if (cur->ns == (xmlNs *)0x0) {
            nsName = (xmlChar *)0x0;
          }
          else {
            nsName = cur->ns->href;
          }
          pxVar2 = (xmlNodePtr)xmlGetPropNodeInternal(parent,cur->name,nsName,1);
          if ((pxVar2 != cur && pxVar2 != (xmlNodePtr)0x0) && (pxVar2->type != XML_ATTRIBUTE_DECL))
          {
            xmlUnlinkNode(pxVar2);
            xmlFreeProp((xmlAttrPtr)pxVar2);
          }
          if (pxVar2 == cur) {
            return cur;
          }
          p_Var1 = (_xmlNode *)parent->properties;
          if ((_xmlNode *)parent->properties != (_xmlNode *)0x0) {
            do {
              p_Var3 = p_Var1;
              p_Var1 = p_Var3->next;
            } while (p_Var3->next != (_xmlNode *)0x0);
            p_Var3->next = cur;
            cur->prev = p_Var3;
            return cur;
          }
        }
        parent->properties = (_xmlAttr *)cur;
        return cur;
      }
    }
  }
  return (xmlNodePtr)0x0;
}

Assistant:

xmlNodePtr
xmlAddChild(xmlNodePtr parent, xmlNodePtr cur) {
    xmlNodePtr prev;

    if ((parent == NULL) || (parent->type == XML_NAMESPACE_DECL)) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlAddChild : parent == NULL\n");
#endif
	return(NULL);
    }

    if ((cur == NULL) || (cur->type == XML_NAMESPACE_DECL)) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlAddChild : child == NULL\n");
#endif
	return(NULL);
    }

    if (parent == cur) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlAddChild : parent == cur\n");
#endif
	return(NULL);
    }
    /*
     * If cur is a TEXT node, merge its content with adjacent TEXT nodes
     * cur is then freed.
     */
    if (cur->type == XML_TEXT_NODE) {
	if ((parent->type == XML_TEXT_NODE) &&
	    (parent->content != NULL) &&
	    (parent->name == cur->name)) {
	    xmlNodeAddContent(parent, cur->content);
	    xmlFreeNode(cur);
	    return(parent);
	}
	if ((parent->last != NULL) && (parent->last->type == XML_TEXT_NODE) &&
	    (parent->last->name == cur->name) &&
	    (parent->last != cur)) {
	    xmlNodeAddContent(parent->last, cur->content);
	    xmlFreeNode(cur);
	    return(parent->last);
	}
    }

    /*
     * add the new element at the end of the children list.
     */
    prev = cur->parent;
    cur->parent = parent;
    if (cur->doc != parent->doc) {
	xmlSetTreeDoc(cur, parent->doc);
    }
    /* this check prevents a loop on tree-traversions if a developer
     * tries to add a node to its parent multiple times
     */
    if (prev == parent)
	return(cur);

    /*
     * Coalescing
     */
    if ((parent->type == XML_TEXT_NODE) &&
	(parent->content != NULL) &&
	(parent != cur)) {
	xmlNodeAddContent(parent, cur->content);
	xmlFreeNode(cur);
	return(parent);
    }
    if (cur->type == XML_ATTRIBUTE_NODE) {
		if (parent->type != XML_ELEMENT_NODE)
			return(NULL);
	if (parent->properties != NULL) {
	    /* check if an attribute with the same name exists */
	    xmlAttrPtr lastattr;

	    if (cur->ns == NULL)
		lastattr = xmlHasNsProp(parent, cur->name, NULL);
	    else
		lastattr = xmlHasNsProp(parent, cur->name, cur->ns->href);
	    if ((lastattr != NULL) && (lastattr != (xmlAttrPtr) cur) && (lastattr->type != XML_ATTRIBUTE_DECL)) {
		/* different instance, destroy it (attributes must be unique) */
			xmlUnlinkNode((xmlNodePtr) lastattr);
		xmlFreeProp(lastattr);
	    }
		if (lastattr == (xmlAttrPtr) cur)
			return(cur);

	}
	if (parent->properties == NULL) {
	    parent->properties = (xmlAttrPtr) cur;
	} else {
	    /* find the end */
	    xmlAttrPtr lastattr = parent->properties;
	    while (lastattr->next != NULL) {
		lastattr = lastattr->next;
	    }
	    lastattr->next = (xmlAttrPtr) cur;
	    ((xmlAttrPtr) cur)->prev = lastattr;
	}
    } else {
	if (parent->children == NULL) {
	    parent->children = cur;
	    parent->last = cur;
	} else {
	    prev = parent->last;
	    prev->next = cur;
	    cur->prev = prev;
	    parent->last = cur;
	}
    }
    return(cur);
}